

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O2

uint128 * __thiscall trng::portable_impl::uint128::operator%=(uint128 *this,uint128 other)

{
  ulong uVar1;
  ulong uVar2;
  int i;
  ulong uVar3;
  bool bVar4;
  uint128 r;
  
  uVar1 = other.m_hi;
  uVar2 = other.m_lo;
  r.m_lo = 0;
  r.m_hi = 0;
  for (uVar3 = 0x7f; 0x3f < uVar3; uVar3 = uVar3 - 1) {
    operator<<=(&r,1);
    r.m_lo = (this->m_hi >> (uVar3 - 0x40 & 0x3f) & 1) != 0 | r.m_lo;
    if ((uVar1 < r.m_hi) || ((r.m_hi == uVar1 && (uVar2 <= r.m_lo)))) {
      bVar4 = r.m_lo < uVar2;
      r.m_lo = r.m_lo - uVar2;
      r.m_hi = (r.m_hi - uVar1) - (ulong)bVar4;
    }
  }
  for (uVar3 = 0x3f; -1 < (int)uVar3; uVar3 = (ulong)((int)uVar3 - 1)) {
    operator<<=(&r,1);
    r.m_lo = (this->m_lo >> (uVar3 & 0x3f) & 1) != 0 | r.m_lo;
    if ((uVar1 < r.m_hi) || ((r.m_hi == uVar1 && (uVar2 <= r.m_lo)))) {
      bVar4 = r.m_lo < uVar2;
      r.m_lo = r.m_lo - uVar2;
      r.m_hi = (r.m_hi - uVar1) - (ulong)bVar4;
    }
  }
  this->m_lo = r.m_lo;
  this->m_hi = r.m_hi;
  return this;
}

Assistant:

uint128 &operator%=(uint128 other) {
        uint128 q;
        uint128 r;
        for (int i{127}; i >= 64; --i) {
          r <<= 1;
          r.m_lo |= (this->m_hi & (1ull << (i - 64))) > 0 ? 1 : 0;
          if (r >= other) {
            r -= other;
            q.m_hi |= 1ull << (i - 64);
          }
        }
        for (int i{63}; i >= 0; --i) {
          r <<= 1;
          r.m_lo |= (this->m_lo & (1ull << i)) > 0 ? 1 : 0;
          if (r >= other) {
            r -= other;
            q.m_lo |= 1ull << i;
          }
        }
        this->m_lo = r.m_lo;
        this->m_hi = r.m_hi;
        return *this;
      }